

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  cmTarget *this_00;
  pointer pcVar1;
  mapped_type *ppcVar2;
  cmGlobalGenerator *this_01;
  pointer local_40 [3];
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> local_28;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> target;
  bool global_local;
  TargetType type_local;
  string *name_local;
  cmMakefile *this_local;
  
  target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
  super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl._3_1_ = global;
  target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
  super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl._4_4_ = type;
  this_00 = (cmTarget *)operator_new(0x1c8);
  cmTarget::cmTarget(this_00,name,
                     target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>.
                     _M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                     super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl._4_4_,
                     (target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>.
                      _M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                      super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl._3_1_ & 1) +
                     VisibilityImported,this);
  std::unique_ptr<cmTarget,std::default_delete<cmTarget>>::
  unique_ptr<std::default_delete<cmTarget>,void>
            ((unique_ptr<cmTarget,std::default_delete<cmTarget>> *)&local_28,this_00);
  pcVar1 = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(&local_28);
  ppcVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
            ::operator[](&this->ImportedTargets,name);
  *ppcVar2 = pcVar1;
  this_01 = GetGlobalGenerator(this);
  pcVar1 = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(&local_28);
  cmGlobalGenerator::IndexTarget(this_01,pcVar1);
  local_40[0] = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(&local_28);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
            (&this->ImportedTargetsOwned,local_40);
  pcVar1 = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::release(&local_28);
  std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::~unique_ptr(&local_28);
  return pcVar1;
}

Assistant:

cmTarget* cmMakefile::AddImportedTarget(const std::string& name,
                                        cmStateEnums::TargetType type,
                                        bool global)
{
  // Create the target.
  std::unique_ptr<cmTarget> target(
    new cmTarget(name, type,
                 global ? cmTarget::VisibilityImportedGlobally
                        : cmTarget::VisibilityImported,
                 this));

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  this->GetGlobalGenerator()->IndexTarget(target.get());

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(target.get());
  return target.release();
}